

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

int __thiscall
CVmObjDict::del_hash_entry
          (CVmObjDict *this,char *str,size_t len,vm_obj_id_t obj,vm_prop_id_t voc_prop)

{
  int iVar1;
  CVmHashEntryDict *this_00;
  vmdict_TrieNode *pvVar2;
  
  this_00 = (CVmHashEntryDict *)
            CVmHashTable::find(*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),str,len);
  if (this_00 != (CVmHashEntryDict *)0x0) {
    pvVar2 = *(vmdict_TrieNode **)((this->super_CVmObject).ext_ + 0x38);
    if (pvVar2 != (vmdict_TrieNode *)0x0) {
      pvVar2 = vmdict_TrieNode::find_word(pvVar2,str,len);
      if ((pvVar2 != (vmdict_TrieNode *)0x0) && (pvVar2->word_cnt != 0)) {
        pvVar2->word_cnt = pvVar2->word_cnt + -1;
      }
    }
    iVar1 = CVmHashEntryDict::del_entry
                      (this_00,*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),obj,voc_prop)
    ;
    return iVar1;
  }
  return 0;
}

Assistant:

int CVmObjDict::del_hash_entry(VMG_ const char *str, size_t len,
                               vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    CVmHashEntryDict *entry;

    /* find the hash table entry for the word */
    entry = (CVmHashEntryDict *)get_ext()->hashtab_->find(str, len);

    /* if we found it, delete the obj/prop entry */
    if (entry != 0)
    {
        /* if we have a trie, delete the trie entry */
        if (get_ext()->trie_ != 0)
            get_ext()->trie_->del_word(str, len);
        
        /* delete the hash table entry */
        return entry->del_entry(get_ext()->hashtab_, obj, voc_prop);
    }

    /* we didn't find anything to delete */
    return FALSE;
}